

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

lys_type * find_orig_type(lys_type *par_type,LY_DATA_TYPE base_type)

{
  LY_DATA_TYPE LVar1;
  lys_node_leaf *plVar2;
  ulong in_RAX;
  lys_type *par_type_00;
  lys_type *plVar3;
  lys_type *prev_type;
  lys_type *type;
  undefined8 uStack_28;
  int found;
  
  uStack_28 = in_RAX;
  while( true ) {
    do {
      type = par_type;
      par_type = &type->der->type;
    } while ((type->der->type).der != (lys_tpdf *)0x0);
    LVar1 = type->base;
    if (LVar1 == LY_TYPE_BITS) {
      return type;
    }
    if (LVar1 != LY_TYPE_LEAFREF) break;
    if ((type->value_flags & 1) != 0) goto LAB_001208de;
    plVar2 = (type->info).lref.target;
    if (plVar2 == (lys_node_leaf *)0x0) {
      __assert_fail("type->info.lref.target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                    ,0x224,"struct lys_type *find_orig_type(struct lys_type *, LY_DATA_TYPE)");
    }
    par_type = &plVar2->type;
    uStack_28 = (ulong)LVar1;
  }
  if (LVar1 == LY_TYPE_UNION) {
    prev_type = (lys_type *)0x0;
    do {
      uStack_28 = uStack_28 & 0xffffffff;
      par_type_00 = lyp_get_next_union_type(type,prev_type,(int *)((long)&uStack_28 + 4));
      if (par_type_00 == (lys_type *)0x0) goto LAB_001208de;
      plVar3 = find_orig_type(par_type_00,(LY_DATA_TYPE)prev_type);
      prev_type = par_type_00;
    } while (plVar3 == (lys_type *)0x0);
  }
  else {
LAB_001208de:
    plVar3 = (lys_type *)0x0;
  }
  return plVar3;
}

Assistant:

static struct lys_type *
find_orig_type(struct lys_type *par_type, LY_DATA_TYPE base_type)
{
    struct lys_type *type, *prev_type, *tmp_type;
    int found;

    /* go through typedefs */
    for (type = par_type; type->der->type.der; type = &type->der->type);

    if (type->base == base_type) {
        /* we have the result */
        return type;
    } else if ((type->base == LY_TYPE_LEAFREF) && !(type->value_flags & LY_VALUE_UNRES)) {
        /* go through the leafref */
        assert(type->info.lref.target);
        return find_orig_type(&((struct lys_node_leaf *)type->info.lref.target)->type, base_type);
    } else if (type->base == LY_TYPE_UNION) {
        /* go through all the union types */
        prev_type = NULL;
        found = 0;
        while ((prev_type = lyp_get_next_union_type(type, prev_type, &found))) {
            tmp_type = find_orig_type(prev_type, base_type);
            if (tmp_type) {
                return tmp_type;
            }
            found = 0;
        }
    }

    /* not found */
    return NULL;
}